

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_sink_set.cc
# Opt level: O3

void __thiscall
absl::lts_20250127::log_internal::LogToSinks
          (log_internal *this,LogEntry *entry,Span<absl::lts_20250127::LogSink_*> extra_sinks,
          bool extra_sinks_only)

{
  long *plVar1;
  undefined8 uVar2;
  long lVar3;
  iterator __begin3;
  undefined8 *puVar4;
  long in_FS_OFFSET;
  string_view message;
  
  anon_unknown_0::GlobalSinks();
  if (extra_sinks.ptr_ != (pointer)0x0) {
    lVar3 = 0;
    do {
      plVar1 = *(long **)((long)&(entry->full_filename_)._M_len + lVar3);
      (**(code **)(*plVar1 + 0x10))(plVar1,this);
      lVar3 = lVar3 + 8;
    } while ((long)extra_sinks.ptr_ << 3 != lVar3);
  }
  if ((char)extra_sinks.len_ == '\0') {
    if (*(char *)(in_FS_OFFSET + -0x20) == '\x01') {
      message._M_len = *(long *)(this + 0x48) - 1;
      message._M_str = *(char **)(this + 0x40);
      WriteToStderr(message,*(LogSeverity *)(this + 0x28));
      return;
    }
    Mutex::ReaderLock((Mutex *)&anon_unknown_0::GlobalSinks::global_sinks);
    *(undefined1 *)(in_FS_OFFSET + -0x20) = 1;
    uVar2 = anon_unknown_0::GlobalSinks::global_sinks.impl_.space_._16_8_;
    for (puVar4 = (undefined8 *)anon_unknown_0::GlobalSinks::global_sinks.impl_.space_._8_8_;
        (undefined8 *)uVar2 != puVar4; puVar4 = puVar4 + 1) {
      (**(code **)(*(long *)*puVar4 + 0x10))((long *)*puVar4,this);
    }
    *(undefined1 *)(in_FS_OFFSET + -0x20) = 0;
    Mutex::ReaderUnlock((Mutex *)&anon_unknown_0::GlobalSinks::global_sinks);
  }
  return;
}

Assistant:

void LogToSinks(const absl::LogEntry& entry,
                absl::Span<absl::LogSink*> extra_sinks, bool extra_sinks_only) {
  log_internal::GlobalSinks().LogToSinks(entry, extra_sinks, extra_sinks_only);
}